

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O3

bool __thiscall TypeInfo::operator<(TypeInfo *this,TypeInfo *rhs)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&this->prefix,&rhs->prefix);
  if (iVar2 < 0) {
    return true;
  }
  sVar1 = (this->prefix)._M_string_length;
  if ((sVar1 == (rhs->prefix)._M_string_length) &&
     ((sVar1 == 0 ||
      (iVar2 = bcmp((this->prefix)._M_dataplus._M_p,(rhs->prefix)._M_dataplus._M_p,sVar1),
      iVar2 == 0)))) {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->type,&rhs->type);
    if (iVar2 < 0) {
      return true;
    }
    sVar1 = (this->type)._M_string_length;
    if ((sVar1 == (rhs->type)._M_string_length) &&
       ((sVar1 == 0 ||
        (iVar2 = bcmp((this->type)._M_dataplus._M_p,(rhs->type)._M_dataplus._M_p,sVar1), iVar2 == 0)
        ))) {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&this->postfix,&rhs->postfix);
      return SUB41((uint)iVar2 >> 0x1f,0);
    }
  }
  return false;
}

Assistant:

bool operator<( TypeInfo const & rhs ) const noexcept
  {
    return ( prefix < rhs.prefix ) || ( ( prefix == rhs.prefix ) && ( ( type < rhs.type ) || ( ( type == rhs.type ) && ( postfix < rhs.postfix ) ) ) );
  }